

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

int64_t __thiscall fasttext::Args::getAutotuneModelSize(Args *this)

{
  char cVar1;
  int iVar2;
  pointer pcVar3;
  _Hash_node_base *p_Var4;
  char *__nptr;
  mapped_type *pmVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  invalid_argument *this_00;
  long lVar9;
  string *__rhs;
  int64_t iVar10;
  char lastCharacter;
  string modelSize;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  units;
  char local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  char *local_c0;
  long local_b8;
  char local_b0 [16];
  Args *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 uStack_78;
  undefined8 uStack_70;
  _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_c0 = local_b0;
  pcVar3 = (this->autotuneModelSize)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar3,pcVar3 + (this->autotuneModelSize)._M_string_length);
  if (local_b8 == 0) {
    iVar10 = -1;
LAB_001248c6:
    if (local_c0 != local_b0) {
      operator_delete(local_c0);
    }
    return iVar10;
  }
  uStack_78 = 0x3b9aca0000000067;
  uStack_70 = 0x3b9aca0000000047;
  local_98._M_dataplus._M_p = (char *)0x3e80000006b;
  local_98._M_string_length = 0x3e80000004b;
  local_98.field_2._M_allocated_capacity = 0xf42400000006d;
  local_98.field_2._8_8_ = 0xf42400000004d;
  std::
  _Hashtable<char,std::pair<char_const,int>,std::allocator<std::pair<char_const,int>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<char_const,int>const*>
            ((_Hashtable<char,std::pair<char_const,int>,std::allocator<std::pair<char_const,int>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_68,&local_98,&local_68,0,&local_c3,&local_c1,&local_c2);
  local_c3 = local_c0[local_b8 + -1];
  local_a0 = this;
  if (local_68._M_buckets[(ulong)(long)local_c3 % local_68._M_bucket_count] != (__node_base_ptr)0x0)
  {
    p_Var4 = local_68._M_buckets[(ulong)(long)local_c3 % local_68._M_bucket_count]->_M_nxt;
    cVar1 = *(char *)&p_Var4[1]._M_nxt;
    do {
      if (local_c3 == cVar1) {
        pmVar5 = std::__detail::
                 _Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_c3);
        lVar9 = (long)*pmVar5;
        std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_c0);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        goto LAB_00124868;
      }
      p_Var4 = p_Var4->_M_nxt;
    } while ((p_Var4 != (_Hash_node_base *)0x0) &&
            (cVar1 = *(char *)&p_Var4[1]._M_nxt,
            (ulong)(long)cVar1 % local_68._M_bucket_count ==
            (ulong)(long)local_c3 % local_68._M_bucket_count));
  }
  lVar9 = 1;
LAB_00124868:
  __nptr = local_c0;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol(__nptr,(char **)&local_98,10);
  if (local_98._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stol");
  }
  else if (*piVar6 != 0x22) {
    if (*piVar6 == 0) {
      *piVar6 = iVar2;
    }
    if ((long)local_98._M_dataplus._M_p - (long)__nptr != local_b8) {
      __rhs = &local_a0->autotuneModelSize;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_98,"Unable to parse model size ",__rhs);
      std::invalid_argument::invalid_argument(this_00,(string *)&local_98);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar10 = lVar7 * lVar9;
    std::
    _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    goto LAB_001248c6;
  }
  uVar8 = std::__throw_out_of_range("stol");
  std::
  _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

int64_t Args::getAutotuneModelSize() const {
  std::string modelSize = autotuneModelSize;
  if (modelSize.empty()) {
    return Args::kUnlimitedModelSize;
  }
  std::unordered_map<char, int> units = {
      {'k', 1000},
      {'K', 1000},
      {'m', 1000000},
      {'M', 1000000},
      {'g', 1000000000},
      {'G', 1000000000},
  };
  uint64_t multiplier = 1;
  char lastCharacter = modelSize.back();
  if (units.count(lastCharacter)) {
    multiplier = units[lastCharacter];
    modelSize = modelSize.substr(0, modelSize.size() - 1);
  }
  uint64_t size = 0;
  size_t nonNumericCharacter = 0;
  bool parseError = false;
  try {
    size = std::stol(modelSize, &nonNumericCharacter);
  } catch (std::invalid_argument&) {
    parseError = true;
  }
  if (!parseError && nonNumericCharacter != modelSize.size()) {
    parseError = true;
  }
  if (parseError) {
    throw std::invalid_argument(
        "Unable to parse model size " + autotuneModelSize);
  }

  return size * multiplier;
}